

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O3

HighsHashTableEntry<int,_int> *
HighsHashTree<int,_int>::findCommonInLeaf<2>(InnerLeaf<2> *leaf,NodePtr n2,int hashPos)

{
  HighsHashTableEntry<int,_int> *pHVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  ValueType *pVVar6;
  HighsHashTableEntry<int,_int> *pHVar7;
  long lVar8;
  ulong *puVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  
  switch((uint)n2.ptrAndType & 7) {
  case 2:
    pHVar7 = HighsHashTree<int,int>::findCommonInLeaf<2,1>
                       (leaf,(InnerLeaf<1> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar7;
  case 3:
    pHVar7 = HighsHashTree<int,int>::findCommonInLeaf<2,2>
                       (leaf,(InnerLeaf<2> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar7;
  case 4:
    pHVar7 = HighsHashTree<int,int>::findCommonInLeaf<2,3>
                       (leaf,(InnerLeaf<3> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar7;
  case 5:
    pHVar7 = HighsHashTree<int,int>::findCommonInLeaf<2,4>
                       (leaf,(InnerLeaf<4> *)(n2.ptrAndType & 0xfffffffffffffff8),hashPos);
    return pHVar7;
  case 6:
    puVar9 = (ulong *)(n2.ptrAndType & 0xfffffffffffffff8);
    uVar11 = (leaf->occupation).occupation & *puVar9;
    if (uVar11 != 0) {
      iVar12 = -1;
      do {
        uVar3 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar5 = (uint)uVar3;
        bVar4 = (byte)uVar3;
        lVar8 = POPCOUNT((leaf->occupation).occupation >> (bVar4 & 0x3f));
        lVar10 = (long)((int)lVar8 + iVar12);
        if (uVar5 != ((uint)(leaf->hashes)._M_elems[lVar10] >> 10 & 0x3f)) {
          lVar8 = lVar8 + iVar12;
          do {
            iVar12 = iVar12 + 1;
            lVar10 = lVar8 + 1;
            lVar8 = lVar8 + 1;
          } while (uVar5 != ((uint)(leaf->hashes)._M_elems[lVar10] >> 10 & 0x3f));
          lVar10 = (long)(int)lVar8;
        }
        uVar2 = *puVar9;
        pHVar7 = (leaf->entries)._M_elems + lVar10;
        do {
          lVar10 = lVar10 + 1;
          pVVar6 = find_recurse((NodePtr)puVar9[POPCOUNT(uVar2 >> (bVar4 & 0x3f))],
                                (ulong)(uint)pHVar7->key_ * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3
                                >> 0x20 ^ (ulong)(uint)pHVar7->key_ * -0x75e7c76a1153eaca +
                                          0x1da24fc66dd63e32,hashPos + 1,&pHVar7->key_);
          if (pVVar6 != (ValueType *)0x0) {
            return pHVar7;
          }
        } while ((lVar10 < leaf->size) &&
                (pHVar1 = pHVar7 + -0x16, pHVar7 = pHVar7 + 1,
                uVar5 == ((uint)pHVar1->key_ >> 10 & 0x3f)));
        bVar13 = 1L << (bVar4 & 0x3f) != uVar11;
        uVar11 = uVar11 ^ 1L << (uVar3 & 0x3f);
      } while (bVar13);
      return (HighsHashTableEntry<int,_int> *)0x0;
    }
  }
  return (HighsHashTableEntry<int,_int> *)0x0;
}

Assistant:

static HighsHashTableEntry<K, V>* findCommonInLeaf(InnerLeaf<SizeClass>* leaf,
                                                     NodePtr n2, int hashPos) {
    switch (n2.getType()) {
      case kInnerLeafSizeClass1:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass1(), hashPos);
      case kInnerLeafSizeClass2:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass2(), hashPos);
      case kInnerLeafSizeClass3:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass3(), hashPos);
      case kInnerLeafSizeClass4:
        return findCommonInLeaf(leaf, n2.getInnerLeafSizeClass4(), hashPos);
      case kBranchNode: {
        BranchNode* branch = n2.getBranchNode();
        uint64_t matchMask = branch->occupation & leaf->occupation;

        int offset = -1;
        while (matchMask) {
          int pos = HighsHashHelpers::log2i(matchMask);
          matchMask ^= (uint64_t{1} << pos);

          int i = leaf->occupation.num_set_until(static_cast<uint8_t>(pos)) +
                  offset;
          while (get_first_chunk16(leaf->hashes[i]) != pos) {
            ++i;
            ++offset;
          }

          int j =
              branch->occupation.num_set_until(static_cast<uint8_t>(pos)) - 1;

          do {
            if (find_recurse(branch->child[j],
                             compute_hash(leaf->entries[i].key()), hashPos + 1,
                             leaf->entries[i].key()))
              return &leaf->entries[i];
            ++i;
          } while (i < leaf->size && get_first_chunk16(leaf->hashes[i]) == pos);
        }
        break;
      }
      default:
        break;
    }

    return nullptr;
  }